

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

void ZXing::Pdf417::RotateArray
               (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *input,vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       *output)

{
  long lVar1;
  pointer pvVar2;
  pointer pvVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __new_size;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  pointer pvVar14;
  ulong uVar15;
  
  pvVar2 = (input->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (input->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __new_size = ((long)pvVar3 - (long)pvVar2 >> 3) * -0x3333333333333333;
  uVar13 = (ulong)(pvVar2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  lVar12 = ((long)(pvVar2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
           (long)(pvVar2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(output,lVar12 + uVar13);
  uVar13 = lVar12 + uVar13;
  if (uVar13 != 0) {
    lVar12 = 0;
    uVar15 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((output->
                           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data + lVar12),__new_size,false);
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 0x28;
    } while (uVar15 < uVar13);
  }
  if (pvVar3 != pvVar2) {
    pvVar2 = (input->
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (output->
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0;
    do {
      if (uVar13 != 0) {
        uVar6 = __new_size + ~uVar15;
        lVar12 = *(long *)&pvVar2[uVar15].super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
        uVar11 = __new_size + 0x3f + ~uVar15;
        if (-1 < (long)uVar6) {
          uVar11 = uVar6;
        }
        bVar5 = (byte)uVar6 & 0x3f;
        lVar1 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
        uVar8 = 0;
        pvVar14 = pvVar3;
        do {
          uVar7 = uVar8 + 0x3f;
          if (-1 < (long)uVar8) {
            uVar7 = uVar8;
          }
          lVar9 = *(long *)&(pvVar14->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data + ((long)uVar11 >> 6) * 8;
          uVar4 = *(ulong *)(lVar1 + lVar9);
          uVar10 = uVar4 | 1L << ((byte)uVar6 & 0x3f);
          if ((*(ulong *)(lVar12 + ((long)uVar7 >> 6) * 8 + -8 +
                         (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar8 & 0x3f) & 1) == 0) {
            uVar10 = uVar4 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          }
          *(ulong *)(lVar1 + lVar9) = uVar10;
          uVar8 = uVar8 + 1;
          pvVar14 = pvVar14 + 1;
        } while (uVar8 < uVar13);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != __new_size + (__new_size == 0));
  }
  return;
}

Assistant:

static void RotateArray(const std::vector<std::vector<bool>>& input, std::vector<std::vector<bool>>& output)
{
	size_t height = input.size();
	size_t width = input[0].size();
	output.resize(width);
	for (size_t i = 0; i < width; ++i) {
		output[i].resize(height);
	}
	for (size_t ii = 0; ii < height; ++ii) {
		// This makes the direction consistent on screen when rotating the screen
		size_t inverseii = height - ii - 1;
		for (size_t jj = 0; jj < width; ++jj) {
			output[jj][inverseii] = input[ii][jj];
		}
	}
}